

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

int32 __thiscall
rw::PluginList::setStreamAlwaysCallback(PluginList *this,uint32 id,AlwaysCallback cb)

{
  Plugin *pPVar1;
  Plugin *pPVar2;
  Plugin *p;
  LLLink *lnk;
  LLLink *_next;
  AlwaysCallback cb_local;
  uint32 id_local;
  PluginList *this_local;
  
  pPVar1 = (Plugin *)(this->plugins).link.next;
  do {
    p = pPVar1;
    pPVar1 = *(Plugin **)p;
    pPVar2 = (Plugin *)LinkList::end(&this->plugins);
    if (p == pPVar2) {
      return -1;
    }
  } while (*(uint32 *)&p[-1].read != id);
  p[-1].inGlobalList.next = (LLLink *)cb;
  return *(int32 *)&p[-1].copy;
}

Assistant:

int32
PluginList::setStreamAlwaysCallback(uint32 id, AlwaysCallback cb)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == id){
			p->alwaysCallback = cb;
			return p->offset;
		}
	}
	return -1;
}